

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

uint8_t * sysbvm_jit_installIn
                    (sysbvm_bytecodeJit_t *jit,uint8_t *codeWriteablePointer,
                    uint8_t *codeExecutablePointer)

{
  uint8_t *puVar1;
  size_t __n;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint8_t *baseAddress;
  long lVar15;
  long lVar16;
  uint8_t *puVar17;
  uint8_t *ehFrameZoneExecutablePointer;
  uint8_t *local_38;
  
  __n = (jit->objectFileHeader).size;
  uVar14 = __n + 0xf & 0xfffffffffffffff0;
  lVar16 = ((jit->instructions).size + 0xf & 0xfffffffffffffff0) + uVar14;
  lVar15 = ((jit->constants).size + 0xf & 0xfffffffffffffff0) + lVar16;
  lVar5 = ((jit->unwindInfo).size + 0xf & 0xfffffffffffffff0) + lVar15;
  lVar7 = ((jit->dwarfEhBuilder).buffer.size + 0xf & 0xfffffffffffffff0) + lVar5;
  lVar12 = ((jit->dwarfDebugInfoBuilder).line.size + 0xf & 0xfffffffffffffff0) + lVar7;
  lVar8 = ((jit->dwarfDebugInfoBuilder).str.size + 0xf & 0xfffffffffffffff0) + lVar12;
  lVar13 = ((jit->dwarfDebugInfoBuilder).abbrev.size + 0xf & 0xfffffffffffffff0) + lVar8;
  lVar9 = ((jit->dwarfDebugInfoBuilder).info.size + 0xf & 0xfffffffffffffff0) + lVar13;
  memcpy(codeWriteablePointer,(jit->objectFileHeader).data,__n);
  puVar1 = codeWriteablePointer + uVar14;
  baseAddress = codeExecutablePointer + uVar14;
  memcpy(puVar1,(jit->instructions).data,(jit->instructions).size);
  memcpy(codeWriteablePointer + lVar16,(jit->constants).data,(jit->constants).size);
  uVar6 = (jit->relocations).size;
  if (uVar6 != 0) {
    plVar10 = (long *)((jit->relocations).data + 0x18);
    uVar11 = 0;
    do {
      lVar2 = plVar10[-3];
      if ((int)plVar10[-2] == 1) {
        *(uint8_t **)(puVar1 + lVar2) =
             codeExecutablePointer +
             *plVar10 + ((plVar10[-1] + lVar16) - (long)(baseAddress + lVar2));
        uVar6 = (jit->relocations).size;
      }
      else if ((int)plVar10[-2] == 0) {
        *(int *)(puVar1 + lVar2) =
             (int)(codeExecutablePointer +
                  *plVar10 + ((plVar10[-1] + lVar16) - (long)(baseAddress + lVar2)));
      }
      uVar11 = uVar11 + 1;
      plVar10 = plVar10 + 4;
    } while (uVar11 < uVar6);
  }
  memcpy(codeWriteablePointer + lVar15,(jit->unwindInfo).data,(jit->unwindInfo).size);
  puVar17 = codeExecutablePointer + lVar5;
  local_38 = puVar17;
  memcpy(codeWriteablePointer + lVar5,(jit->dwarfEhBuilder).buffer.data,
         (jit->dwarfEhBuilder).buffer.size);
  sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo
            (&jit->dwarfDebugInfoBuilder,(uintptr_t)baseAddress);
  memcpy(codeWriteablePointer + lVar7,(jit->dwarfDebugInfoBuilder).line.data,
         (jit->dwarfDebugInfoBuilder).line.size);
  memcpy(codeWriteablePointer + lVar12,(jit->dwarfDebugInfoBuilder).str.data,
         (jit->dwarfDebugInfoBuilder).str.size);
  memcpy(codeWriteablePointer + lVar8,(jit->dwarfDebugInfoBuilder).abbrev.data,
         (jit->dwarfDebugInfoBuilder).abbrev.size);
  memcpy(codeWriteablePointer + lVar13,(jit->dwarfDebugInfoBuilder).info.data,
         (jit->dwarfDebugInfoBuilder).info.size);
  puVar1 = codeWriteablePointer + lVar9;
  memcpy(puVar1,(jit->objectFileContent).data,(jit->objectFileContent).size);
  sVar3 = (jit->objectFileContent).size;
  sVar4 = (jit->dwarfEhBuilder).fdeInitialLocationOffset;
  if (sVar4 != 0) {
    *(int *)(codeWriteablePointer + lVar5 + sVar4) = ((int)baseAddress - (int)puVar17) - (int)sVar4;
  }
  *(uint8_t **)(codeWriteablePointer + 0x28) =
       puVar1 + (sVar3 - (long)codeWriteablePointer) + -0x280;
  *(ulong *)(puVar1 + (sVar3 - 0x228)) = uVar14;
  *(uint8_t **)(puVar1 + (sVar3 - 0x230)) = baseAddress;
  *(size_t *)(puVar1 + (sVar3 - 0x220)) = (jit->instructions).size;
  *(long *)(puVar1 + (sVar3 - 0x1e8)) = lVar5;
  *(uint8_t **)(puVar1 + (sVar3 - 0x1f0)) = puVar17;
  sVar4 = (jit->dwarfEhBuilder).buffer.size;
  *(size_t *)(puVar1 + (sVar3 - 0x1e0)) = sVar4;
  *(long *)(puVar1 + (sVar3 - 0x1a8)) = lVar7;
  *(size_t *)(puVar1 + (sVar3 - 0x1a0)) = (jit->dwarfDebugInfoBuilder).line.size;
  *(long *)(puVar1 + (sVar3 - 0x168)) = lVar12;
  *(size_t *)(puVar1 + (sVar3 - 0x160)) = (jit->dwarfDebugInfoBuilder).str.size;
  *(long *)(puVar1 + (sVar3 - 0x128)) = lVar8;
  *(size_t *)(puVar1 + (sVar3 - 0x120)) = (jit->dwarfDebugInfoBuilder).abbrev.size;
  *(long *)(puVar1 + (sVar3 - 0xe8)) = lVar13;
  *(size_t *)(puVar1 + (sVar3 - 0xe0)) = (jit->dwarfDebugInfoBuilder).info.size;
  *(long *)(puVar1 + (sVar3 - 0xa8)) = *(long *)(puVar1 + (sVar3 - 0xa8)) + lVar9;
  *(long *)(puVar1 + (sVar3 - 0x68)) = *(long *)(puVar1 + (sVar3 - 0x68)) + lVar9;
  *(long *)(puVar1 + (sVar3 - 0x28)) = *(long *)(puVar1 + (sVar3 - 0x28)) + lVar9;
  if (sVar4 != 0) {
    sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames,&local_38);
    __register_frame(local_38);
  }
  return baseAddress;
}

Assistant:

SYSBVM_API uint8_t *sysbvm_jit_installIn(sysbvm_bytecodeJit_t *jit, uint8_t *codeWriteablePointer, uint8_t *codeExecutablePointer)
{
    size_t objectFileHeaderOffset = 0;
    size_t codeOffset = sysbvm_sizeAlignedTo(jit->objectFileHeader.size, 16);
    size_t constantsOffset = codeOffset + sysbvm_sizeAlignedTo(jit->instructions.size, 16);

    size_t unwindInfoOffset = constantsOffset + sysbvm_sizeAlignedTo(jit->constants.size, 16);
    size_t ehFrameOffset = unwindInfoOffset + sysbvm_sizeAlignedTo(jit->unwindInfo.size, 16);
    size_t debugLineOffset = ehFrameOffset + sysbvm_sizeAlignedTo(jit->dwarfEhBuilder.buffer.size, 16);
    size_t debugStrOffset = debugLineOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.line.size, 16);
    size_t debugAbbrevOffset = debugStrOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.str.size, 16);
    size_t debugInfoOffset = debugAbbrevOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.abbrev.size, 16);

    size_t objectFileContentOffset = debugInfoOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.info.size, 16);

    uint8_t *objectFileHeaderPointer = codeWriteablePointer + objectFileHeaderOffset;
    uint8_t *objectFileHeaderExecutablePointer = codeExecutablePointer + objectFileHeaderOffset;
    memcpy(objectFileHeaderPointer, jit->objectFileHeader.data, jit->objectFileHeader.size);

    uint8_t *instructionsPointers = codeWriteablePointer + codeOffset;
    uint8_t *instructionsExecutablePointers = codeExecutablePointer + codeOffset;
    memcpy(instructionsPointers, jit->instructions.data, jit->instructions.size);

    uint8_t *constantZonePointer = codeWriteablePointer + constantsOffset;
    uint8_t *constantZoneExecutablePointer = codeExecutablePointer + constantsOffset;
    memcpy(constantZonePointer, jit->constants.data, jit->constants.size);

    for(size_t i = 0; i < jit->relocations.size; ++i)
    {
        sysbvm_bytecodeJitRelocation_t *relocation = sysbvm_dynarray_entryOfTypeAt(jit->relocations, sysbvm_bytecodeJitRelocation_t, i);
        uint8_t *relocationTarget = instructionsPointers + relocation->offset;
        uint8_t *relocationExecutableTarget = instructionsExecutablePointers + relocation->offset;
        intptr_t relocationTargetAddress = (intptr_t)relocationExecutableTarget;

        intptr_t relativeValue = (intptr_t)constantZoneExecutablePointer + relocation->value - relocationTargetAddress + relocation->addend;
        switch(relocation->type)
        {
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE32:
            *((int32_t*)relocationTarget) = (int32_t)relativeValue;
            break;
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE64:
            *((int64_t*)relocationTarget) = (int64_t)relativeValue;
            break;
        }
    }

    uint8_t *unwindInfoZonePointer = codeWriteablePointer + unwindInfoOffset;
    uint8_t *unwindInfoZoneExecutablePointer = codeExecutablePointer + unwindInfoOffset;
    memcpy(unwindInfoZonePointer, jit->unwindInfo.data, jit->unwindInfo.size);

    uint8_t *ehFrameZonePointer = codeWriteablePointer + ehFrameOffset;
    uint8_t *ehFrameZoneExecutablePointer = codeExecutablePointer + ehFrameOffset;
    memcpy(ehFrameZonePointer, jit->dwarfEhBuilder.buffer.data, jit->dwarfEhBuilder.buffer.size);

    sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo(&jit->dwarfDebugInfoBuilder, (uintptr_t)instructionsExecutablePointers);

    uint8_t *debugLineZonePointer = codeWriteablePointer + debugLineOffset;
    uint8_t *debugLineZoneExecutablePointer = codeExecutablePointer + debugLineOffset;
    memcpy(debugLineZonePointer, jit->dwarfDebugInfoBuilder.line.data, jit->dwarfDebugInfoBuilder.line.size);

    uint8_t *debugStrZonePointer = codeWriteablePointer + debugStrOffset;
    uint8_t *debugStrZoneExecutablePointer = codeExecutablePointer + debugStrOffset;
    memcpy(debugStrZonePointer, jit->dwarfDebugInfoBuilder.str.data, jit->dwarfDebugInfoBuilder.str.size);

    uint8_t *debugAbbrevZonePointer = codeWriteablePointer + debugAbbrevOffset;
    uint8_t *debugAbbrevZoneExecutablePointer = codeExecutablePointer + debugAbbrevOffset;
    memcpy(debugAbbrevZonePointer, jit->dwarfDebugInfoBuilder.abbrev.data, jit->dwarfDebugInfoBuilder.abbrev.size);

    uint8_t *debugInfoZonePointer = codeWriteablePointer + debugInfoOffset;
    uint8_t *debugInfoZoneExecutablePointer = codeExecutablePointer + debugInfoOffset;
    memcpy(debugInfoZonePointer, jit->dwarfDebugInfoBuilder.info.data, jit->dwarfDebugInfoBuilder.info.size);

    uint8_t *objectFileContentPointer = codeWriteablePointer + objectFileContentOffset;
    uint8_t *objectFileContentExecutablePointer = codeExecutablePointer + objectFileContentOffset;
    memcpy(objectFileContentPointer, jit->objectFileContent.data, jit->objectFileContent.size);

    sysbvm_jit_fixupObjectFile(jit,
        (sysbvm_elf64_header_t*)objectFileHeaderPointer,
        (sysbvm_elf64_header_t*)objectFileHeaderExecutablePointer,
        instructionsExecutablePointers,
        ehFrameZonePointer, ehFrameZoneExecutablePointer,
        debugLineZoneExecutablePointer,
        debugStrZoneExecutablePointer,
        debugAbbrevZoneExecutablePointer,
        debugInfoZoneExecutablePointer,
        objectFileContentExecutablePointer,
        (sysbvm_jit_x64_elfContentFooter_t*) (objectFileContentPointer + jit->objectFileContent.size - sizeof(sysbvm_jit_x64_elfContentFooter_t))
    );

    sysbvm_jit_emitPerfSymbolFor(jit, instructionsPointers);

#ifdef _WIN32
    RUNTIME_FUNCTION *runtimeFunction = (RUNTIME_FUNCTION*)unwindInfoZoneExecutablePointer;
    runtimeFunction->UnwindInfoAddress = (DWORD)(sizeof(RUNTIME_FUNCTION) + unwindInfoZoneExecutablePointer - instructionsExecutablePointers);
    if(RtlAddFunctionTable(runtimeFunction, 1, (DWORD64)(uintptr_t)instructionsExecutablePointers))
    {
        // Store the handle in the context for cleanup.
    }
#else
    (void)unwindInfoZoneExecutablePointer;
    if(jit->dwarfEhBuilder.buffer.size > 0)
    {
#   ifdef __APPLE__
        // It takes the FDE parameter
        if(jit->dwarfEhBuilder.fdeOffset > 0)
        {
            void *fdePointer = ehFrameZoneExecutablePointer + jit->dwarfEhBuilder.fdeOffset;
            sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &fdePointer);
            __register_frame(fdePointer);
        }
#   else
        // Send the eh_frame section.
        sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &ehFrameZoneExecutablePointer);
        __register_frame(ehFrameZoneExecutablePointer);
#   endif
    }
#endif

    return instructionsExecutablePointers;
}